

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O1

void __thiscall CppUnit::TestPath::insert(TestPath *this,Test *test,int index)

{
  int iVar1;
  out_of_range *this_00;
  ulong uVar2;
  ulong uVar3;
  Test *local_60;
  iterator local_58;
  const_iterator local_38;
  
  local_60 = test;
  if (-1 < index) {
    iVar1 = (*this->_vptr_TestPath[10])();
    if (index <= iVar1) {
      local_38._M_cur =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_38._M_first =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_first;
      local_38._M_node =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      uVar2 = ((long)local_38._M_cur - (long)local_38._M_first >> 3) + (ulong)(uint)index;
      if (uVar2 < 0x40) {
        local_38._M_last =
             (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
        local_38._M_cur = local_38._M_cur + (uint)index;
      }
      else {
        uVar3 = uVar2 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar2) {
          uVar3 = uVar2 >> 6;
        }
        local_38._M_node = local_38._M_node + uVar3;
        local_38._M_first = *local_38._M_node;
        local_38._M_last = local_38._M_first + 0x40;
        local_38._M_cur = local_38._M_first + uVar2 + uVar3 * -0x40;
      }
      std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::insert
                (&local_58,&this->m_tests,&local_38,&local_60);
      return;
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"TestPath::insert(): index out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void 
TestPath::insert( Test *test, 
                  int index )
{
  if ( index < 0  ||  index > getTestCount() )
    throw std::out_of_range( "TestPath::insert(): index out of range" );
  m_tests.insert( m_tests.begin() + index, test );
}